

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WhereOrderByLimitOptLabel(WhereInfo *pWInfo)

{
  WhereLevel *pInner;
  WhereInfo *pWInfo_local;
  
  if (pWInfo->bOrderedInnerLoop == '\0') {
    pWInfo_local._4_4_ = pWInfo->iContinue;
  }
  else {
    pWInfo_local._4_4_ = pWInfo->a[(int)(pWInfo->nLevel - 1)].addrNxt;
  }
  return pWInfo_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3WhereOrderByLimitOptLabel(WhereInfo *pWInfo){
  WhereLevel *pInner;
  if( !pWInfo->bOrderedInnerLoop ){
    /* The ORDER BY LIMIT optimization does not apply.  Jump to the 
    ** continuation of the inner-most loop. */
    return pWInfo->iContinue;
  }
  pInner = &pWInfo->a[pWInfo->nLevel-1];
  assert( pInner->addrNxt!=0 );
  return pInner->addrNxt;
}